

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall DifferentialEquation::~DifferentialEquation(DifferentialEquation *this)

{
  DifferentialEquation *this_local;
  
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_0018e8c0;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_0018e950;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_0018e998;
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::~vector
            (&this->eqnIntegrators);
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::~vector
            (&this->eqnIntegrands);
  StochasticVariable::~StochasticVariable(&this->super_StochasticVariable);
  return;
}

Assistant:

DifferentialEquation::~DifferentialEquation()
{
}